

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O0

ON_XMLNode * __thiscall ON_PostEffects::CImpl::PostEffectsNode(CImpl *this)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  wchar_t *pwVar3;
  undefined4 extraout_var;
  ON_XMLNode *post_effects_node;
  CImpl *this_local;
  
  pOVar2 = ON_InternalXMLImpl::Node(&this->super_ON_InternalXMLImpl);
  pwVar3 = XMLPathPeps();
  iVar1 = (*pOVar2->_vptr_ON_XMLNode[0x2a])(pOVar2,pwVar3);
  this_local = (CImpl *)CONCAT44(extraout_var,iVar1);
  if (this_local == (CImpl *)0x0) {
    ON_REMOVE_ASAP_AssertEx
              (0,
               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_post_effects.cpp"
               ,0x1d8,"","false is false");
    this_local = (CImpl *)&g_panic_node;
  }
  return (ON_XMLNode *)this_local;
}

Assistant:

ON_XMLNode& ON_PostEffects::CImpl::PostEffectsNode(void) const
{
  ON_XMLNode* post_effects_node = Node().CreateNodeAtPath(XMLPathPeps());
  if (nullptr != post_effects_node)
    return *post_effects_node;

  // Should never get here.
  ON_ASSERT(false);
  return g_panic_node;
}